

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qgraphicswidget.cpp
# Opt level: O0

void QGraphicsWidget::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  anon_union_4_2_313b0b05_for_QSizePolicy_1 *paVar1;
  QWindow *this;
  bool bVar2;
  int iVar3;
  QSizePolicy QVar4;
  LayoutDirection LVar5;
  WindowFlags WVar6;
  QGraphicsLayout *pQVar7;
  QtMocHelpers *in_RCX;
  uint in_EDX;
  int in_ESI;
  QGraphicsWidget *in_RDI;
  long in_FS_OFFSET;
  QSizeF QVar8;
  void *_v_1;
  void *_v;
  bool _r;
  QWindow *_t;
  QPalette *in_stack_fffffffffffffed8;
  QGraphicsWidget *in_stack_fffffffffffffee0;
  QGraphicsWidget *in_stack_fffffffffffffee8;
  undefined4 in_stack_fffffffffffffef0;
  uint in_stack_fffffffffffffef4;
  QGraphicsWidget *in_stack_fffffffffffffef8;
  undefined8 in_stack_ffffffffffffff08;
  QFlagsStorage<Qt::WindowType> wFlags;
  undefined8 local_a8;
  undefined8 local_a0;
  undefined8 local_98;
  undefined8 local_90;
  qreal local_68;
  qreal local_60;
  qreal local_58;
  qreal local_50;
  qreal local_48;
  qreal local_40;
  qreal local_38;
  qreal local_30;
  QFont local_28 [16];
  QPalette local_18;
  long local_8;
  
  wFlags.i = (Int)((ulong)in_stack_ffffffffffffff08 >> 0x20);
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  if (in_ESI == 0) {
    in_stack_fffffffffffffef4 = in_EDX;
    if (in_EDX == 0) {
      geometryChanged((QWindow *)0xa501ed);
    }
    else if (in_EDX == 1) {
      layoutChanged((QWindow *)0xa501f9);
    }
    else if (in_EDX == 2) {
      iVar3 = close(in_RDI,0);
      if (*(long *)in_RCX != 0) {
        **(byte **)in_RCX = (byte)iVar3 & 1;
      }
    }
  }
  if (in_ESI == 5) {
    bVar2 = QtMocHelpers::indexOfMethod<void(QGraphicsWidget::*)()>
                      (in_RCX,(void **)geometryChanged,0,0);
    if (bVar2) goto LAB_00a50713;
    wFlags.i = 0;
    bVar2 = QtMocHelpers::indexOfMethod<void(QGraphicsWidget::*)()>
                      (in_RCX,(void **)layoutChanged,0,1);
    if (bVar2) goto LAB_00a50713;
  }
  if (in_ESI == 1) {
    paVar1 = *(anon_union_4_2_313b0b05_for_QSizePolicy_1 **)in_RCX;
    in_stack_fffffffffffffee8 = (QGraphicsWidget *)(ulong)in_EDX;
    switch(in_stack_fffffffffffffee8) {
    case (QGraphicsWidget *)0x0:
      palette(in_stack_fffffffffffffee8);
      QPalette::operator=((QPalette *)in_stack_fffffffffffffee0,in_stack_fffffffffffffed8);
      QPalette::~QPalette(&local_18);
      break;
    case (QGraphicsWidget *)0x1:
      font(in_stack_fffffffffffffef8);
      QFont::operator=((QFont *)in_stack_fffffffffffffee0,(QFont *)in_stack_fffffffffffffed8);
      QFont::~QFont(local_28);
      break;
    case (QGraphicsWidget *)0x2:
      LVar5 = layoutDirection((QGraphicsWidget *)0xa5035c);
      paVar1->data = LVar5;
      break;
    case (QGraphicsWidget *)0x3:
      QVar8 = size(in_stack_fffffffffffffee8);
      local_38 = QVar8.wd;
      *(qreal *)paVar1 = local_38;
      local_30 = QVar8.ht;
      *(qreal *)(paVar1 + 2) = local_30;
      break;
    case (QGraphicsWidget *)0x4:
      QVar8 = QGraphicsLayoutItem::minimumSize((QGraphicsLayoutItem *)in_stack_fffffffffffffef8);
      local_48 = QVar8.wd;
      *(qreal *)paVar1 = local_48;
      local_40 = QVar8.ht;
      *(qreal *)(paVar1 + 2) = local_40;
      break;
    case (QGraphicsWidget *)0x5:
      QVar8 = QGraphicsLayoutItem::preferredSize((QGraphicsLayoutItem *)in_stack_fffffffffffffef8);
      local_58 = QVar8.wd;
      *(qreal *)paVar1 = local_58;
      local_50 = QVar8.ht;
      *(qreal *)(paVar1 + 2) = local_50;
      break;
    case (QGraphicsWidget *)0x6:
      QVar8 = QGraphicsLayoutItem::maximumSize((QGraphicsLayoutItem *)in_stack_fffffffffffffef8);
      local_68 = QVar8.wd;
      *(qreal *)paVar1 = local_68;
      local_60 = QVar8.ht;
      *(qreal *)(paVar1 + 2) = local_60;
      break;
    case (QGraphicsWidget *)0x7:
      QVar4 = QGraphicsLayoutItem::sizePolicy((QGraphicsLayoutItem *)in_stack_fffffffffffffee0);
      paVar1->bits = (Bits)QVar4.field_0;
      break;
    case (QGraphicsWidget *)0x8:
      LVar5 = focusPolicy(in_stack_fffffffffffffee0);
      paVar1->data = LVar5;
      break;
    case (QGraphicsWidget *)0x9:
      WVar6 = windowFlags(in_stack_fffffffffffffee0);
      paVar1->bits = (Bits)WVar6.super_QFlagsStorageHelper<Qt::WindowType,_4>.
                           super_QFlagsStorage<Qt::WindowType>.i;
      break;
    case (QGraphicsWidget *)0xa:
      windowTitle(in_stack_fffffffffffffee8);
      QString::operator=((QString *)in_stack_fffffffffffffee0,(QString *)in_stack_fffffffffffffed8);
      QString::~QString((QString *)0xa504ff);
      break;
    case (QGraphicsWidget *)0xb:
      QGraphicsLayoutItem::geometry
                ((QGraphicsLayoutItem *)
                 CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0));
      *(undefined8 *)paVar1 = local_a8;
      *(undefined8 *)(paVar1 + 2) = local_a0;
      *(undefined8 *)(paVar1 + 4) = local_98;
      *(undefined8 *)(paVar1 + 6) = local_90;
      break;
    case (QGraphicsWidget *)0xc:
      bVar2 = autoFillBackground(in_stack_fffffffffffffee0);
      *(bool *)paVar1 = bVar2;
      break;
    case (QGraphicsWidget *)0xd:
      pQVar7 = layout(in_stack_fffffffffffffee0);
      *(QGraphicsLayout **)paVar1 = pQVar7;
    }
  }
  if (in_ESI == 2) {
    this = *(QWindow **)in_RCX;
    in_stack_fffffffffffffee0 = (QGraphicsWidget *)(ulong)in_EDX;
    LVar5 = (LayoutDirection)((ulong)in_stack_fffffffffffffee8 >> 0x20);
    switch(in_stack_fffffffffffffee0) {
    case (QGraphicsWidget *)0x0:
      setPalette(this,(QPalette *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0));
      break;
    case (QGraphicsWidget *)0x1:
      setFont(this,(QFont *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0));
      break;
    case (QGraphicsWidget *)0x2:
      setLayoutDirection((QWindow *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
                         LVar5);
      break;
    case (QGraphicsWidget *)0x3:
      resize((QWindow *)in_stack_fffffffffffffee8,(QSizeF *)in_stack_fffffffffffffee0);
      break;
    case (QGraphicsWidget *)0x4:
      QGraphicsLayoutItem::setMinimumSize
                ((QGraphicsLayoutItem *)in_stack_fffffffffffffee0,
                 (QSizeF *)in_stack_fffffffffffffed8);
      break;
    case (QGraphicsWidget *)0x5:
      QGraphicsLayoutItem::setPreferredSize
                ((QGraphicsLayoutItem *)in_stack_fffffffffffffee0,
                 (QSizeF *)in_stack_fffffffffffffed8);
      break;
    case (QGraphicsWidget *)0x6:
      QGraphicsLayoutItem::setMaximumSize
                ((QGraphicsLayoutItem *)in_stack_fffffffffffffee0,
                 (QSizeF *)in_stack_fffffffffffffed8);
      break;
    case (QGraphicsWidget *)0x7:
      QGraphicsLayoutItem::setSizePolicy
                ((QGraphicsLayoutItem *)
                 CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
                 (QSizePolicy *)in_stack_fffffffffffffee8);
      break;
    case (QGraphicsWidget *)0x8:
      setFocusPolicy((QWindow *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),LVar5)
      ;
      break;
    case (QGraphicsWidget *)0x9:
      setWindowFlags(this,(WindowFlags)wFlags.i);
      break;
    case (QGraphicsWidget *)0xa:
      setWindowTitle((QWindow *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
                     (QString *)in_stack_fffffffffffffee8);
      break;
    case (QGraphicsWidget *)0xb:
      (**(code **)(*(long *)in_RDI + 0x60))(in_RDI,this);
      break;
    case (QGraphicsWidget *)0xc:
      setAutoFillBackground(this,SUB41(in_stack_fffffffffffffef4 >> 0x18,0));
      break;
    case (QGraphicsWidget *)0xd:
      setLayout(this,(QGraphicsLayout *)
                     CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0));
    }
  }
  if ((in_ESI == 3) && (in_EDX == 2)) {
    unsetLayoutDirection((QWindow *)in_stack_fffffffffffffee0);
  }
LAB_00a50713:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QGraphicsWidget::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    auto *_t = static_cast<QGraphicsWidget *>(_o);
    if (_c == QMetaObject::InvokeMetaMethod) {
        switch (_id) {
        case 0: _t->geometryChanged(); break;
        case 1: _t->layoutChanged(); break;
        case 2: { bool _r = _t->close();
            if (_a[0]) *reinterpret_cast< bool*>(_a[0]) = std::move(_r); }  break;
        default: ;
        }
    }
    if (_c == QMetaObject::IndexOfMethod) {
        if (QtMocHelpers::indexOfMethod<void (QGraphicsWidget::*)()>(_a, &QGraphicsWidget::geometryChanged, 0))
            return;
        if (QtMocHelpers::indexOfMethod<void (QGraphicsWidget::*)()>(_a, &QGraphicsWidget::layoutChanged, 1))
            return;
    }
    if (_c == QMetaObject::ReadProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 0: *reinterpret_cast<QPalette*>(_v) = _t->palette(); break;
        case 1: *reinterpret_cast<QFont*>(_v) = _t->font(); break;
        case 2: *reinterpret_cast<Qt::LayoutDirection*>(_v) = _t->layoutDirection(); break;
        case 3: *reinterpret_cast<QSizeF*>(_v) = _t->size(); break;
        case 4: *reinterpret_cast<QSizeF*>(_v) = _t->minimumSize(); break;
        case 5: *reinterpret_cast<QSizeF*>(_v) = _t->preferredSize(); break;
        case 6: *reinterpret_cast<QSizeF*>(_v) = _t->maximumSize(); break;
        case 7: *reinterpret_cast<QSizePolicy*>(_v) = _t->sizePolicy(); break;
        case 8: *reinterpret_cast<Qt::FocusPolicy*>(_v) = _t->focusPolicy(); break;
        case 9: *reinterpret_cast<Qt::WindowFlags*>(_v) = _t->windowFlags(); break;
        case 10: *reinterpret_cast<QString*>(_v) = _t->windowTitle(); break;
        case 11: *reinterpret_cast<QRectF*>(_v) = _t->geometry(); break;
        case 12: *reinterpret_cast<bool*>(_v) = _t->autoFillBackground(); break;
        case 13: *reinterpret_cast<QGraphicsLayout**>(_v) = _t->layout(); break;
        default: break;
        }
    }
    if (_c == QMetaObject::WriteProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 0: _t->setPalette(*reinterpret_cast<QPalette*>(_v)); break;
        case 1: _t->setFont(*reinterpret_cast<QFont*>(_v)); break;
        case 2: _t->setLayoutDirection(*reinterpret_cast<Qt::LayoutDirection*>(_v)); break;
        case 3: _t->resize(*reinterpret_cast<QSizeF*>(_v)); break;
        case 4: _t->setMinimumSize(*reinterpret_cast<QSizeF*>(_v)); break;
        case 5: _t->setPreferredSize(*reinterpret_cast<QSizeF*>(_v)); break;
        case 6: _t->setMaximumSize(*reinterpret_cast<QSizeF*>(_v)); break;
        case 7: _t->setSizePolicy(*reinterpret_cast<QSizePolicy*>(_v)); break;
        case 8: _t->setFocusPolicy(*reinterpret_cast<Qt::FocusPolicy*>(_v)); break;
        case 9: _t->setWindowFlags(*reinterpret_cast<Qt::WindowFlags*>(_v)); break;
        case 10: _t->setWindowTitle(*reinterpret_cast<QString*>(_v)); break;
        case 11: _t->setGeometry(*reinterpret_cast<QRectF*>(_v)); break;
        case 12: _t->setAutoFillBackground(*reinterpret_cast<bool*>(_v)); break;
        case 13: _t->setLayout(*reinterpret_cast<QGraphicsLayout**>(_v)); break;
        default: break;
        }
    }
if (_c == QMetaObject::ResetProperty) {
        switch (_id) {
        case 2: _t->unsetLayoutDirection(); break;
        default: break;
        }
    }
}